

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * create_output_path_abi_cxx11_(char *path)

{
  time_t in_RSI;
  allocator local_a9;
  char local_a8 [8];
  char file_name_buffer [128];
  tm *time_info;
  time_t rawtime;
  char *path_local;
  
  rawtime = in_RSI;
  path_local = path;
  time((time_t *)&time_info);
  file_name_buffer._120_8_ = localtime((time_t *)&time_info);
  strftime(local_a8,0x80,(char *)rawtime,(tm *)file_name_buffer._120_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)path,local_a8,&local_a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  return path;
}

Assistant:

std::string create_output_path(const char* path)
{
    time_t rawtime;
    time(&rawtime);
    struct tm* time_info = localtime (&rawtime);
    char file_name_buffer[128];
    strftime(file_name_buffer, 128, path, time_info);

    return file_name_buffer;
}